

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::LockEnter(Mutex *mu,GraphId id,SynchLocksHeld *held_locks)

{
  int iVar1;
  bool local_29;
  int local_28;
  int i;
  int n;
  SynchLocksHeld *held_locks_local;
  Mutex *mu_local;
  GraphId id_local;
  
  iVar1 = held_locks->n;
  local_28 = 0;
  mu_local = (Mutex *)id.handle;
  while( true ) {
    local_29 = false;
    if (local_28 != iVar1) {
      local_29 = synchronization_internal::GraphId::operator!=
                           (&held_locks->locks[local_28].id,(GraphId *)&mu_local);
    }
    if (local_29 == false) break;
    local_28 = local_28 + 1;
  }
  if (local_28 == iVar1) {
    if (iVar1 == 0x28) {
      held_locks->overflow = true;
    }
    else {
      held_locks->locks[local_28].mu = mu;
      held_locks->locks[local_28].count = 1;
      held_locks->locks[local_28].id.handle = (uint64_t)mu_local;
      held_locks->n = iVar1 + 1;
    }
  }
  else {
    held_locks->locks[local_28].count = held_locks->locks[local_28].count + 1;
  }
  return;
}

Assistant:

static void LockEnter(Mutex* mu, GraphId id, SynchLocksHeld* held_locks) {
  int n = held_locks->n;
  int i = 0;
  while (i != n && held_locks->locks[i].id != id) {
    i++;
  }
  if (i == n) {
    if (n == ABSL_ARRAYSIZE(held_locks->locks)) {
      held_locks->overflow = true;  // lost some data
    } else {                        // we have room for lock
      held_locks->locks[i].mu = mu;
      held_locks->locks[i].count = 1;
      held_locks->locks[i].id = id;
      held_locks->n = n + 1;
    }
  } else {
    held_locks->locks[i].count++;
  }
}